

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O3

raw_ostream * __thiscall llvm::raw_ostream::operator<<(raw_ostream *this,FormattedBytes *FB)

{
  FormattedBytes FVar1;
  byte bVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  uchar UC;
  ulong uVar7;
  uint uVar8;
  byte *__n;
  HexPrintStyle Style;
  byte *extraout_RDX;
  byte *extraout_RDX_00;
  byte *extraout_RDX_01;
  byte *extraout_RDX_02;
  byte *extraout_RDX_03;
  byte *__buf;
  byte *extraout_RDX_04;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  undefined8 in_R9;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  Optional<unsigned_long> Width;
  Optional<unsigned_long> Width_00;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  
  uVar3 = *(ulong *)(FB + 8);
  if (uVar3 != 0) {
    lVar15 = *(long *)FB;
    FVar1 = FB[0x29];
    if (FB[0x18] == (FormattedBytes)0x1) {
      lVar10 = (uVar3 - uVar3 % (ulong)*(uint *)(FB + 0x24)) + *(long *)(FB + 0x10);
      uVar11 = lVar10 - 1;
      if (uVar11 == 0) {
        uVar8 = 0x40;
      }
      else {
        lVar5 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        uVar8 = (uint)lVar5 ^ 0x3f;
      }
      Style = 0x43 - uVar8 >> 2;
      if (Style < 5) {
        Style = 4;
      }
      if (lVar10 == 0) {
        Style = 4;
      }
    }
    else {
      Style = Upper;
    }
    uVar11 = (ulong)(byte)FB[0x28];
    if (uVar11 == 0) {
      __assert_fail("Align != 0u && \"Align can\'t be 0.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/MathExtras.h"
                    ,0x2ae,"uint64_t llvm::alignTo(uint64_t, uint64_t, uint64_t)");
    }
    uVar8 = *(uint *)(FB + 0x24);
    uVar14 = 0;
    iVar6 = (int)(((uVar11 + uVar8) - 1) / uVar11);
    uVar11 = uVar3;
    do {
      indent(this,*(uint *)(FB + 0x20));
      __buf = extraout_RDX;
      if (FB[0x18] == (FormattedBytes)0x1) {
        Width.Storage._8_8_ = in_R9;
        Width.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer =
             (AlignedCharArray<8UL,_8UL>)0x1;
        llvm::write_hex((llvm *)this,(raw_ostream *)(*(long *)(FB + 0x10) + uVar14),
                        (ulong)((byte)FVar1 ^ 1),Style,Width);
        Str.Length = 2;
        Str.Data = ": ";
        operator<<(this,Str);
        __buf = extraout_RDX_00;
      }
      uVar9 = *(uint *)(FB + 0x24);
      uVar13 = (ulong)uVar9;
      uVar7 = uVar13;
      if (uVar11 < uVar13) {
        uVar7 = uVar11;
      }
      if (uVar13 == 0) {
        uVar13 = 0;
        __n = (byte *)0x0;
      }
      else {
        uVar13 = 0;
        uVar12 = 0;
        do {
          if ((uVar12 != 0) && (uVar12 % (ulong)(byte)FB[0x28] == 0)) {
            uVar13 = uVar13 + 1;
            Str_00.Length = 1;
            Str_00.Data = " ";
            operator<<(this,Str_00);
          }
          __n = (byte *)0x2;
          Width_00.Storage._8_8_ = in_R9;
          Width_00.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer =
               (AlignedCharArray<8UL,_8UL>)0x1;
          llvm::write_hex((llvm *)this,(raw_ostream *)(ulong)*(byte *)(lVar15 + uVar12),
                          (ulong)((byte)FVar1 ^ 1),PrefixUpper,Width_00);
          uVar12 = uVar12 + 1;
          uVar13 = uVar13 + 2;
          __buf = extraout_RDX_01;
        } while (uVar7 + (uVar7 == 0) != uVar12);
      }
      if (FB[0x2a] != (FormattedBytes)0x0) {
        if ((iVar6 + uVar8 * 2) - 1 < uVar13) {
          __assert_fail("BlockCharWidth >= CharsPrinted",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/raw_ostream.cpp"
                        ,0x1b1,"raw_ostream &llvm::raw_ostream::operator<<(const FormattedBytes &)")
          ;
        }
        indent(this,(iVar6 + uVar8 * 2 + 1) - (int)uVar13);
        Str_01.Length = 1;
        Str_01.Data = "|";
        operator<<(this,Str_01);
        __buf = extraout_RDX_02;
        if (uVar9 != 0) {
          uVar13 = 0;
          do {
            bVar2 = *(byte *)(lVar15 + uVar13);
            __buf = (byte *)this->OutBufEnd;
            __n = (byte *)this->OutBufCur;
            if ((byte)(bVar2 - 0x20) < 0x5f) {
              if (__n < __buf) {
                __buf = __n + 1;
                this->OutBufCur = (char *)__buf;
                *__n = bVar2;
              }
              else {
                uVar9 = (uint)bVar2;
LAB_00161e33:
                write(this,uVar9,__buf,(size_t)__n);
                __buf = extraout_RDX_03;
              }
            }
            else {
              if (__buf <= __n) {
                uVar9 = 0x2e;
                goto LAB_00161e33;
              }
              this->OutBufCur = (char *)(__n + 1);
              *__n = 0x2e;
            }
            uVar13 = uVar13 + 1;
          } while (uVar7 != uVar13);
        }
        pcVar4 = this->OutBufCur;
        if (pcVar4 < this->OutBufEnd) {
          __n = (byte *)(pcVar4 + 1);
          this->OutBufCur = (char *)__n;
          *pcVar4 = '|';
        }
        else {
          write(this,0x7c,__buf,(size_t)__n);
          __buf = extraout_RDX_04;
        }
      }
      uVar14 = uVar14 + uVar7;
      if (uVar14 < uVar3) {
        pcVar4 = this->OutBufCur;
        if (pcVar4 < this->OutBufEnd) {
          this->OutBufCur = pcVar4 + 1;
          *pcVar4 = '\n';
        }
        else {
          write(this,10,__buf,(size_t)__n);
        }
      }
      uVar11 = uVar11 - uVar7;
      lVar15 = lVar15 + uVar7;
    } while (uVar11 != 0);
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::operator<<(const FormattedBytes &FB) {
  if (FB.Bytes.empty())
    return *this;

  size_t LineIndex = 0;
  auto Bytes = FB.Bytes;
  const size_t Size = Bytes.size();
  HexPrintStyle HPS = FB.Upper ? HexPrintStyle::Upper : HexPrintStyle::Lower;
  uint64_t OffsetWidth = 0;
  if (FB.FirstByteOffset.hasValue()) {
    // Figure out how many nibbles are needed to print the largest offset
    // represented by this data set, so that we can align the offset field
    // to the right width.
    size_t Lines = Size / FB.NumPerLine;
    uint64_t MaxOffset = *FB.FirstByteOffset + Lines * FB.NumPerLine;
    unsigned Power = 0;
    if (MaxOffset > 0)
      Power = llvm::Log2_64_Ceil(MaxOffset);
    OffsetWidth = std::max<uint64_t>(4, llvm::alignTo(Power, 4) / 4);
  }

  // The width of a block of data including all spaces for group separators.
  unsigned NumByteGroups =
      alignTo(FB.NumPerLine, FB.ByteGroupSize) / FB.ByteGroupSize;
  unsigned BlockCharWidth = FB.NumPerLine * 2 + NumByteGroups - 1;

  while (!Bytes.empty()) {
    indent(FB.IndentLevel);

    if (FB.FirstByteOffset.hasValue()) {
      uint64_t Offset = FB.FirstByteOffset.getValue();
      llvm::write_hex(*this, Offset + LineIndex, HPS, OffsetWidth);
      *this << ": ";
    }

    auto Line = Bytes.take_front(FB.NumPerLine);

    size_t CharsPrinted = 0;
    // Print the hex bytes for this line in groups
    for (size_t I = 0; I < Line.size(); ++I, CharsPrinted += 2) {
      if (I && (I % FB.ByteGroupSize) == 0) {
        ++CharsPrinted;
        *this << " ";
      }
      llvm::write_hex(*this, Line[I], HPS, 2);
    }

    if (FB.ASCII) {
      // Print any spaces needed for any bytes that we didn't print on this
      // line so that the ASCII bytes are correctly aligned.
      assert(BlockCharWidth >= CharsPrinted);
      indent(BlockCharWidth - CharsPrinted + 2);
      *this << "|";

      // Print the ASCII char values for each byte on this line
      for (uint8_t Byte : Line) {
        if (isPrint(Byte))
          *this << static_cast<char>(Byte);
        else
          *this << '.';
      }
      *this << '|';
    }

    Bytes = Bytes.drop_front(Line.size());
    LineIndex += Line.size();
    if (LineIndex < Size)
      *this << '\n';
  }
  return *this;
}